

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestCaseFilter::TestCaseFilter(TestCaseFilter *this,string *testSpec,DoWhat matchBehaviour)

{
  pointer pcVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  DoWhat DVar6;
  string *lc;
  size_type sVar7;
  bool bVar8;
  undefined1 *local_d8;
  ulong local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined1 *local_90;
  size_t local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_98 = &(this->m_stringToMatch).field_2;
  (this->m_stringToMatch)._M_dataplus._M_p = (pointer)local_98;
  pcVar1 = (testSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + testSpec->_M_string_length);
  sVar2 = (this->m_stringToMatch)._M_string_length;
  if (sVar2 != 0) {
    pcVar1 = (this->m_stringToMatch)._M_dataplus._M_p;
    sVar7 = 0;
    do {
      iVar5 = tolower((int)pcVar1[sVar7]);
      pcVar1[sVar7] = (char)iVar5;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  this->m_filterType = matchBehaviour;
  this->m_wildcardPosition = NoWildcard;
  if (matchBehaviour == AutoDetectBehaviour) {
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"exclude:","");
    uVar4 = local_d0;
    uVar3 = (this->m_stringToMatch)._M_string_length;
    if (uVar3 < local_d0) {
LAB_001409bc:
      bVar8 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)this);
      if (local_88 != local_d0) goto LAB_001409bc;
      if (local_88 == 0) {
        bVar8 = true;
      }
      else {
        iVar5 = bcmp(local_90,local_d8,local_88);
        bVar8 = iVar5 == 0;
      }
    }
    if ((uVar4 <= uVar3) && (local_90 != local_80)) {
      operator_delete(local_90);
    }
    if (local_d8 != local_c8) {
      operator_delete(local_d8);
    }
    if (bVar8) {
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)this);
LAB_00140ab2:
      std::__cxx11::string::operator=((string *)this,(string *)&local_d8);
      if (local_d8 != local_c8) {
        operator_delete(local_d8);
      }
      DVar6 = ExcludeTests;
    }
    else {
      local_d8 = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"~","");
      uVar4 = local_d0;
      uVar3 = (this->m_stringToMatch)._M_string_length;
      if (uVar3 < local_d0) {
LAB_00140a69:
        bVar8 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
        if (local_68 != local_d0) goto LAB_00140a69;
        if (local_68 == 0) {
          bVar8 = true;
        }
        else {
          iVar5 = bcmp(local_70,local_d8,local_68);
          bVar8 = iVar5 == 0;
        }
      }
      if ((uVar4 <= uVar3) && (local_70 != local_60)) {
        operator_delete(local_70);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8);
      }
      DVar6 = IncludeTests;
      if (bVar8) {
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)this);
        goto LAB_00140ab2;
      }
    }
    this->m_filterType = DVar6;
  }
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"*","");
  uVar4 = local_d0;
  uVar3 = (this->m_stringToMatch)._M_string_length;
  if (uVar3 < local_d0) {
LAB_00140b42:
    bVar8 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)this);
    if (local_48 != local_d0) goto LAB_00140b42;
    if (local_48 == 0) {
      bVar8 = true;
    }
    else {
      iVar5 = bcmp(local_50,local_d8,local_48);
      bVar8 = iVar5 == 0;
    }
  }
  if ((uVar4 <= uVar3) && (local_50 != local_40)) {
    operator_delete(local_50);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  if (bVar8) {
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_d8);
    if (local_d8 != local_c8) {
      operator_delete(local_d8);
    }
    *(undefined1 *)&this->m_wildcardPosition = (char)this->m_wildcardPosition | WildcardAtStart;
  }
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"*","");
  uVar4 = local_b0;
  uVar3 = (this->m_stringToMatch)._M_string_length;
  if (local_b0 <= uVar3) {
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)this);
    if (local_d0 == local_b0) {
      if (local_d0 == 0) {
        bVar8 = true;
      }
      else {
        iVar5 = bcmp(local_d8,local_b8,local_d0);
        bVar8 = iVar5 == 0;
      }
      goto LAB_00140c16;
    }
  }
  bVar8 = false;
LAB_00140c16:
  if ((uVar4 <= uVar3) && (local_d8 != local_c8)) {
    operator_delete(local_d8);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (bVar8) {
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_b8);
    if (local_b8 != local_a8) {
      operator_delete(local_b8);
    }
    *(undefined1 *)&this->m_wildcardPosition = (char)this->m_wildcardPosition | WildcardAtEnd;
  }
  return;
}

Assistant:

TestCaseFilter( std::string const& testSpec, IfFilterMatches::DoWhat matchBehaviour = IfFilterMatches::AutoDetectBehaviour )
        :   m_stringToMatch( toLower( testSpec ) ),
            m_filterType( matchBehaviour ),
            m_wildcardPosition( NoWildcard )
        {
            if( m_filterType == IfFilterMatches::AutoDetectBehaviour ) {
                if( startsWith( m_stringToMatch, "exclude:" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 8 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else if( startsWith( m_stringToMatch, "~" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 1 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else {
                    m_filterType = IfFilterMatches::IncludeTests;
                }
            }

            if( startsWith( m_stringToMatch, "*" ) ) {
                m_stringToMatch = m_stringToMatch.substr( 1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtStart );
            }
            if( endsWith( m_stringToMatch, "*" ) ) {
                m_stringToMatch = m_stringToMatch.substr( 0, m_stringToMatch.size()-1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtEnd );
            }
        }